

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop.cpp
# Opt level: O1

int __thiscall ncnn::UnaryOp::forward_inplace(UnaryOp *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  uint uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  
  switch(this->op_type) {
  case 0:
    uVar2 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    if (0 < (int)uVar2) {
      pvVar1 = bottom_top_blob->data;
      uVar3 = 0;
      do {
        *(uint *)((long)pvVar1 + uVar3 * 4) = *(uint *)((long)pvVar1 + uVar3 * 4) & 0x7fffffff;
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    break;
  case 1:
    uVar2 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    if (0 < (int)uVar2) {
      pvVar1 = bottom_top_blob->data;
      uVar3 = 0;
      do {
        *(uint *)((long)pvVar1 + uVar3 * 4) = *(uint *)((long)pvVar1 + uVar3 * 4) ^ 0x80000000;
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    break;
  case 2:
    uVar2 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    if (0 < (int)uVar2) {
      pvVar1 = bottom_top_blob->data;
      uVar3 = 0;
      do {
        fVar4 = floorf(*(float *)((long)pvVar1 + uVar3 * 4));
        *(float *)((long)pvVar1 + uVar3 * 4) = fVar4;
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    break;
  case 3:
    uVar2 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    if (0 < (int)uVar2) {
      pvVar1 = bottom_top_blob->data;
      uVar3 = 0;
      do {
        fVar4 = ceilf(*(float *)((long)pvVar1 + uVar3 * 4));
        *(float *)((long)pvVar1 + uVar3 * 4) = fVar4;
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    break;
  case 4:
    uVar2 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    if (0 < (int)uVar2) {
      pvVar1 = bottom_top_blob->data;
      uVar3 = 0;
      do {
        fVar4 = *(float *)((long)pvVar1 + uVar3 * 4);
        *(float *)((long)pvVar1 + uVar3 * 4) = fVar4 * fVar4;
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    break;
  case 5:
    uVar2 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    if (0 < (int)uVar2) {
      pvVar1 = bottom_top_blob->data;
      uVar3 = 0;
      do {
        *(float *)((long)pvVar1 + uVar3 * 4) = SQRT(*(float *)((long)pvVar1 + uVar3 * 4));
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    break;
  case 6:
    uVar2 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    if (0 < (int)uVar2) {
      pvVar1 = bottom_top_blob->data;
      uVar3 = 0;
      do {
        fVar4 = *(float *)((long)pvVar1 + uVar3 * 4);
        auVar6 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar4));
        fVar5 = auVar6._0_4_;
        *(float *)((long)pvVar1 + uVar3 * 4) = fVar5 * -0.5 * (fVar4 * fVar5 * fVar5 + -3.0);
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    break;
  case 7:
    uVar2 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    if (0 < (int)uVar2) {
      pvVar1 = bottom_top_blob->data;
      uVar3 = 0;
      do {
        fVar4 = expf(*(float *)((long)pvVar1 + uVar3 * 4));
        *(float *)((long)pvVar1 + uVar3 * 4) = fVar4;
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    break;
  case 8:
    uVar2 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    if (0 < (int)uVar2) {
      pvVar1 = bottom_top_blob->data;
      uVar3 = 0;
      do {
        fVar4 = logf(*(float *)((long)pvVar1 + uVar3 * 4));
        *(float *)((long)pvVar1 + uVar3 * 4) = fVar4;
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    break;
  case 9:
    uVar2 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    if (0 < (int)uVar2) {
      pvVar1 = bottom_top_blob->data;
      uVar3 = 0;
      do {
        fVar4 = sinf(*(float *)((long)pvVar1 + uVar3 * 4));
        *(float *)((long)pvVar1 + uVar3 * 4) = fVar4;
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    break;
  case 10:
    uVar2 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    if (0 < (int)uVar2) {
      pvVar1 = bottom_top_blob->data;
      uVar3 = 0;
      do {
        fVar4 = cosf(*(float *)((long)pvVar1 + uVar3 * 4));
        *(float *)((long)pvVar1 + uVar3 * 4) = fVar4;
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    break;
  case 0xb:
    uVar2 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    if (0 < (int)uVar2) {
      pvVar1 = bottom_top_blob->data;
      uVar3 = 0;
      do {
        fVar4 = tanf(*(float *)((long)pvVar1 + uVar3 * 4));
        *(float *)((long)pvVar1 + uVar3 * 4) = fVar4;
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    break;
  case 0xc:
    uVar2 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    if (0 < (int)uVar2) {
      pvVar1 = bottom_top_blob->data;
      uVar3 = 0;
      do {
        fVar4 = asinf(*(float *)((long)pvVar1 + uVar3 * 4));
        *(float *)((long)pvVar1 + uVar3 * 4) = fVar4;
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    break;
  case 0xd:
    uVar2 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    if (0 < (int)uVar2) {
      pvVar1 = bottom_top_blob->data;
      uVar3 = 0;
      do {
        fVar4 = acosf(*(float *)((long)pvVar1 + uVar3 * 4));
        *(float *)((long)pvVar1 + uVar3 * 4) = fVar4;
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    break;
  case 0xe:
    uVar2 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    if (0 < (int)uVar2) {
      pvVar1 = bottom_top_blob->data;
      uVar3 = 0;
      do {
        fVar4 = atanf(*(float *)((long)pvVar1 + uVar3 * 4));
        *(float *)((long)pvVar1 + uVar3 * 4) = fVar4;
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    break;
  case 0xf:
    uVar2 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    if (0 < (int)uVar2) {
      pvVar1 = bottom_top_blob->data;
      uVar3 = 0;
      do {
        *(float *)((long)pvVar1 + uVar3 * 4) = 1.0 / *(float *)((long)pvVar1 + uVar3 * 4);
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    break;
  case 0x10:
    uVar2 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    if (0 < (int)uVar2) {
      pvVar1 = bottom_top_blob->data;
      uVar3 = 0;
      do {
        fVar4 = tanhf(*(float *)((long)pvVar1 + uVar3 * 4));
        *(float *)((long)pvVar1 + uVar3 * 4) = fVar4;
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    break;
  case 0x11:
    uVar2 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    if (0 < (int)uVar2) {
      pvVar1 = bottom_top_blob->data;
      uVar3 = 0;
      do {
        fVar4 = log10f(*(float *)((long)pvVar1 + uVar3 * 4));
        *(float *)((long)pvVar1 + uVar3 * 4) = fVar4;
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
  }
  return 0;
}

Assistant:

int UnaryOp::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    if (op_type == Operation_LOG10)
        return unary_op_inplace<unary_op_log10>(bottom_top_blob, opt);

    return 0;
}